

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_DoChannelAdaption
                  (PaAlsaStreamComponent *self,PaUtilBufferProcessor *bp,int numFrames)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  pthread_t __thread1;
  char *errorText;
  bool bVar4;
  uchar *local_60;
  int __pa_unsure_error_id;
  uchar *buffer;
  int swidth;
  int convertMono;
  uchar *dst;
  uchar *src;
  int unusedChans;
  int i;
  uchar *p;
  PaError result;
  int numFrames_local;
  PaUtilBufferProcessor *bp_local;
  PaAlsaStreamComponent *self_local;
  
  src._0_4_ = self->numHostChannels - self->numUserChannels;
  bVar4 = false;
  if (self->numHostChannels % 2 == 0) {
    bVar4 = self->numUserChannels % 2 != 0;
  }
  if (self->streamDir == StreamDirection_Out) {
    if (self->hostInterleaved == 0) {
      if (bVar4) {
        iVar1 = (*alsa_snd_pcm_area_copy)
                          (self->channelAreas + self->numUserChannels,self->offset,
                           self->channelAreas + (self->numUserChannels + -1),self->offset,numFrames,
                           self->nativeFormat);
        if (iVar1 < 0) {
          __thread1 = pthread_self();
          iVar2 = pthread_equal(__thread1,paUnixMainThread);
          if (iVar2 != 0) {
            errorText = (*alsa_snd_strerror)(iVar1);
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,errorText);
          }
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_area_copy( self->channelAreas + self->numUserChannels, self->offset, self->channelAreas + ( self->numUserChannels - 1 ), self->offset, numFrames, self->nativeFormat )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3567\n"
                           );
          return -9999;
        }
        src._0_4_ = (uint)src - 1;
      }
      if (0 < (int)(uint)src) {
        (*alsa_snd_pcm_areas_silence)
                  (self->channelAreas + (int)(self->numHostChannels - (uint)src),self->offset,
                   (uint)src,(long)numFrames,self->nativeFormat);
      }
    }
    else {
      sVar3 = (*alsa_snd_pcm_format_size)(self->nativeFormat,1);
      iVar1 = (int)sVar3;
      if (self->canMmap == 0) {
        local_60 = (uchar *)self->nonMmapBuffer;
      }
      else {
        local_60 = ExtractAddress(self->channelAreas,self->offset);
      }
      _unusedChans = local_60 + self->numUserChannels * iVar1;
      if (bVar4) {
        dst = local_60 + (self->numUserChannels + -1) * iVar1;
        for (src._4_4_ = 0; src._4_4_ < numFrames; src._4_4_ = src._4_4_ + 1) {
          memcpy(dst + iVar1,dst,(long)iVar1);
          dst = dst + self->numHostChannels * iVar1;
        }
        _unusedChans = _unusedChans + iVar1;
        src._0_4_ = (uint)src - 1;
      }
      if (0 < (int)(uint)src) {
        for (src._4_4_ = 0; src._4_4_ < numFrames; src._4_4_ = src._4_4_ + 1) {
          memset(_unusedChans,0,(long)(int)(iVar1 * (uint)src));
          _unusedChans = _unusedChans + self->numHostChannels * iVar1;
        }
      }
    }
    return 0;
  }
  __assert_fail("StreamDirection_Out == self->streamDir",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                ,0xdc5,
                "PaError PaAlsaStreamComponent_DoChannelAdaption(PaAlsaStreamComponent *, PaUtilBufferProcessor *, int)"
               );
}

Assistant:

static PaError PaAlsaStreamComponent_DoChannelAdaption( PaAlsaStreamComponent *self, PaUtilBufferProcessor *bp, int numFrames )
{
    PaError result = paNoError;
    unsigned char *p;
    int i;
    int unusedChans = self->numHostChannels - self->numUserChannels;
    unsigned char *src, *dst;
    int convertMono = ( self->numHostChannels % 2 ) == 0 && ( self->numUserChannels % 2 ) != 0;

    assert( StreamDirection_Out == self->streamDir );

    if( self->hostInterleaved )
    {
        int swidth = alsa_snd_pcm_format_size( self->nativeFormat, 1 );
        unsigned char *buffer = self->canMmap ? ExtractAddress( self->channelAreas, self->offset ) : self->nonMmapBuffer;

        /* Start after the last user channel */
        p = buffer + self->numUserChannels * swidth;

        if( convertMono )
        {
            /* Convert the last user channel into stereo pair */
            src = buffer + ( self->numUserChannels - 1 ) * swidth;
            for( i = 0; i < numFrames; ++i )
            {
                dst = src + swidth;
                memcpy( dst, src, swidth );
                src += self->numHostChannels * swidth;
            }

            /* Don't touch the channel we just wrote to */
            p += swidth;
            --unusedChans;
        }

        if( unusedChans > 0 )
        {
            /* Silence unused output channels */
            for( i = 0; i < numFrames; ++i )
            {
                memset( p, 0, swidth * unusedChans );
                p += self->numHostChannels * swidth;
            }
        }
    }
    else
    {
        /* We extract the last user channel */
        if( convertMono )
        {
            ENSURE_( alsa_snd_pcm_area_copy( self->channelAreas + self->numUserChannels, self->offset, self->channelAreas +
                    ( self->numUserChannels - 1 ), self->offset, numFrames, self->nativeFormat ), paUnanticipatedHostError );
            --unusedChans;
        }
        if( unusedChans > 0 )
        {
            alsa_snd_pcm_areas_silence( self->channelAreas + ( self->numHostChannels - unusedChans ), self->offset, unusedChans, numFrames,
                    self->nativeFormat );
        }
    }

error:
    return result;
}